

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_msl_add_resource_binding_2
          (spvc_compiler compiler,spvc_msl_resource_binding_2 *binding)

{
  spvc_context this;
  spvc_result sVar1;
  MSLResourceBinding bind;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  MSLResourceBinding local_38;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    local_38.binding = binding->binding;
    local_38._4_8_ = (ulong)binding->desc_set << 0x20;
    local_38.stage = binding->stage;
    local_38.msl_buffer = binding->msl_buffer;
    local_38.msl_texture = binding->msl_texture;
    local_38.msl_sampler = binding->msl_sampler;
    local_38.count = binding->count;
    spirv_cross::CompilerMSL::add_msl_resource_binding
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,&local_38);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"MSL function used on a non-MSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_58);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_add_resource_binding_2(spvc_compiler compiler,
                                                     const spvc_msl_resource_binding_2 *binding)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLResourceBinding bind;
	bind.binding = binding->binding;
	bind.desc_set = binding->desc_set;
	bind.stage = static_cast<spv::ExecutionModel>(binding->stage);
	bind.msl_buffer = binding->msl_buffer;
	bind.msl_texture = binding->msl_texture;
	bind.msl_sampler = binding->msl_sampler;
	bind.count = binding->count;
	msl.add_msl_resource_binding(bind);
	return SPVC_SUCCESS;
#else
	(void)binding;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}